

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::udp_tracker_connection::on_timeout(udp_tracker_connection *this,error_code *ec)

{
  shared_ptr<libtorrent::aux::request_callback> cb;
  error_code local_20;
  
  if (ec->failed_ == true) {
    fail(this,ec,timer,"",(seconds32)0x0,(seconds32)0x1e);
    return;
  }
  tracker_connection::requester((tracker_connection *)&cb);
  if (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    (*(cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_vptr_request_callback[7])
              (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,"*** UDP_TRACKER [ timed out url: %s ]",
               (this->super_tracker_connection).m_req.url._M_dataplus._M_p);
  }
  boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
            (&local_20,timed_out,(type *)0x0);
  fail(this,&local_20,timer,"",(seconds32)0x0,(seconds32)0x1e);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void udp_tracker_connection::on_timeout(error_code const& ec)
	{
		if (ec)
		{
			fail(ec, operation_t::timer);
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		std::shared_ptr<request_callback> cb = requester();
		if (cb) cb->debug_log("*** UDP_TRACKER [ timed out url: %s ]", tracker_req().url.c_str());
#endif
		fail(error_code(errors::timed_out), operation_t::timer);
	}